

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

void cmsys::SystemTools::ConvertToUnixSlashes(string *path)

{
  char *__s;
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  passwd *ppVar5;
  long lVar6;
  char cVar7;
  string user;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar4 = (path->_M_dataplus)._M_p;
  cVar7 = *pcVar4;
  lVar6 = 0;
  bVar3 = false;
  do {
    if (cVar7 == '\\') {
      cVar7 = ' ';
      if (pcVar4[lVar6 + 1] != ' ') {
        (path->_M_dataplus)._M_p[lVar6] = '/';
        goto LAB_003eceac;
      }
    }
    else {
      if (cVar7 == '\0') {
        if (bVar3) {
          ReplaceString(path,"//","/");
        }
        if (path->_M_string_length != 0) {
          pcVar4 = (path->_M_dataplus)._M_p;
          if (*pcVar4 == '~') {
            cVar7 = pcVar4[1];
            if ((cVar7 == '/') || (cVar7 == '\0')) {
              pcVar4 = getenv("HOME");
              if (pcVar4 != (char *)0x0) {
                strlen(pcVar4);
                std::__cxx11::string::replace((ulong)path,0,(char *)0x1,(ulong)pcVar4);
              }
            }
            else {
              pcVar4 = (char *)std::__cxx11::string::find_first_of((char *)path,0x4d4370,0);
              std::__cxx11::string::substr((ulong)local_38,(ulong)path);
              ppVar5 = getpwnam((char *)local_38[0]);
              if (ppVar5 != (passwd *)0x0) {
                __s = ppVar5->pw_dir;
                strlen(__s);
                std::__cxx11::string::replace((ulong)path,0,pcVar4,(ulong)__s);
              }
              if (local_38[0] != local_28) {
                operator_delete(local_38[0],local_28[0] + 1);
              }
            }
          }
          uVar1 = path->_M_string_length;
          if (((1 < uVar1) && (pcVar2 = (path->_M_dataplus)._M_p, pcVar2[uVar1 - 1] == '/')) &&
             ((uVar1 != 3 || (pcVar2[1] != ':')))) {
            std::__cxx11::string::resize((ulong)path,(char)uVar1 + -1);
          }
        }
        return;
      }
LAB_003eceac:
      cVar7 = pcVar4[lVar6 + 1];
      if (((cVar7 == '/') && (cVar7 = '/', pcVar4[lVar6 + 2] == '/')) && (!bVar3)) {
        bVar3 = true;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void SystemTools::ConvertToUnixSlashes(kwsys_stl::string& path)
{
  const char* pathCString = path.c_str();
  bool hasDoubleSlash = false;
#ifdef __VMS
  ConvertVMSToUnix(path);
#else
  const char* pos0 = pathCString;
  const char* pos1 = pathCString+1;
  for (kwsys_stl::string::size_type pos = 0; *pos0; ++ pos )
    {
    // make sure we don't convert an escaped space to a unix slash
    if ( *pos0 == '\\' && *pos1 != ' ' )
      {
      path[pos] = '/';
      }

    // Also, reuse the loop to check for slash followed by another slash
    if (*pos1 == '/' && *(pos1+1) == '/' && !hasDoubleSlash)
      {
#ifdef _WIN32
      // However, on windows if the first characters are both slashes,
      // then keep them that way, so that network paths can be handled.
      if ( pos > 0)
        {
        hasDoubleSlash = true;
        }
#else
      hasDoubleSlash = true;
#endif
      }

    pos0 ++;
    pos1 ++;
    }

  if ( hasDoubleSlash )
    {
    SystemTools::ReplaceString(path, "//", "/");
    }
#endif
  // remove any trailing slash
  if(!path.empty())
    {
    // if there is a tilda ~ then replace it with HOME
    pathCString = path.c_str();
    if(pathCString[0] == '~' && (pathCString[1] == '/' || pathCString[1] == '\0'))
      {
      const char* homeEnv = SystemTools::GetEnv("HOME");
      if (homeEnv)
        {
        path.replace(0,1,homeEnv);
        }
      }
#ifdef HAVE_GETPWNAM
    else if(pathCString[0] == '~')
      {
      kwsys_stl::string::size_type idx = path.find_first_of("/\0");
      kwsys_stl::string user = path.substr(1, idx-1);
      passwd* pw = getpwnam(user.c_str());
      if(pw)
        {
        path.replace(0, idx, pw->pw_dir);
        }
      }
#endif
    // remove trailing slash if the path is more than
    // a single /
    pathCString = path.c_str();
    size_t size = path.size();
    if(size > 1 && *path.rbegin() == '/')
      {
      // if it is c:/ then do not remove the trailing slash
      if(!((size == 3 && pathCString[1] == ':')))
        {
        path.resize(size - 1);
        }
      }
    }
}